

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O1

void ExtractAlphaRows(VP8LDecoder *dec,int last_row)

{
  uint32_t *puVar1;
  void *pvVar2;
  bool bVar3;
  uint32_t *rows;
  int start_row;
  uint8_t *puVar4;
  uint8_t *puVar5;
  int num_rows;
  int iVar6;
  int iVar7;
  uint8_t *puVar8;
  int iVar9;
  
  start_row = dec->last_row;
  if (last_row - start_row != 0 && start_row <= last_row) {
    rows = dec->pixels + (long)dec->width * (long)start_row;
    iVar6 = last_row - start_row;
    do {
      num_rows = 0x10;
      if (iVar6 < 0x10) {
        num_rows = iVar6;
      }
      puVar1 = dec->argb_cache;
      pvVar2 = dec->io->opaque;
      iVar7 = dec->io->width;
      puVar4 = (uint8_t *)((long)(iVar7 * start_row) + *(long *)((long)pvVar2 + 200));
      ApplyInverseTransforms(dec,start_row,num_rows,rows);
      (*WebPExtractGreen)(puVar1,puVar4,iVar7 * num_rows);
      if (*(int *)((long)pvVar2 + 0xc) != 0) {
        puVar8 = *(uint8_t **)((long)pvVar2 + 0xd0);
        iVar9 = num_rows;
        do {
          puVar5 = puVar4;
          (*WebPUnfilters[*(uint *)((long)pvVar2 + 0xc)])(puVar8,puVar5,puVar5,iVar7);
          iVar9 = iVar9 + -1;
          puVar4 = puVar5 + iVar7;
          puVar8 = puVar5;
        } while (iVar9 != 0);
        *(long *)((long)pvVar2 + 0xd0) = (long)(puVar5 + iVar7) - (long)iVar7;
      }
      start_row = start_row + num_rows;
      rows = rows + (long)num_rows * (long)dec->width;
      iVar7 = iVar6 - num_rows;
      bVar3 = num_rows <= iVar6;
      iVar6 = iVar7;
    } while (iVar7 != 0 && bVar3);
  }
  dec->last_out_row = last_row;
  dec->last_row = last_row;
  return;
}

Assistant:

static void ExtractAlphaRows(VP8LDecoder* const dec, int last_row) {
  int cur_row = dec->last_row;
  int num_rows = last_row - cur_row;
  const uint32_t* in = dec->pixels + dec->width * cur_row;

  assert(last_row <= dec->io->crop_bottom);
  while (num_rows > 0) {
    const int num_rows_to_process =
        (num_rows > NUM_ARGB_CACHE_ROWS) ? NUM_ARGB_CACHE_ROWS : num_rows;
    // Extract alpha (which is stored in the green plane).
    ALPHDecoder* const alph_dec = (ALPHDecoder*)dec->io->opaque;
    uint8_t* const output = alph_dec->output;
    const int width = dec->io->width;      // the final width (!= dec->width)
    const int cache_pixs = width * num_rows_to_process;
    uint8_t* const dst = output + width * cur_row;
    const uint32_t* const src = dec->argb_cache;
    ApplyInverseTransforms(dec, cur_row, num_rows_to_process, in);
    WebPExtractGreen(src, dst, cache_pixs);
    AlphaApplyFilter(alph_dec,
                     cur_row, cur_row + num_rows_to_process, dst, width);
    num_rows -= num_rows_to_process;
    in += num_rows_to_process * dec->width;
    cur_row += num_rows_to_process;
  }
  assert(cur_row == last_row);
  dec->last_row = dec->last_out_row = last_row;
}